

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithreaded_test.cpp
# Opt level: O0

int main(void)

{
  size_t *this;
  int iVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  __shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  allocator<char> local_6e1;
  string local_6e0;
  shared_ptr<chaiscript::detail::Exception_Handler_Base> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  int local_650;
  allocator<char> local_649;
  string local_648;
  shared_ptr<chaiscript::detail::Exception_Handler_Base> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  stringstream local_5b8 [8];
  stringstream ss;
  ostream local_5a8 [376];
  ulong local_430;
  size_t i_2;
  size_t i_1;
  value_type local_418;
  ulong local_408;
  size_t i;
  ulong local_3f8;
  size_t num_threads;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> threads;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>,_std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>_>
  local_390;
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  local_388;
  undefined1 local_380 [8];
  ChaiScript_Basic chai;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  char *modulepath;
  char *usepath;
  
  usepath._4_4_ = 0;
  modulepath = getenv("CHAI_USE_PATH");
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)getenv("CHAI_MODULE_PATH");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
             (char (*) [1])0x41e0e0);
  if (modulepath != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
               &modulepath);
  }
  this = &chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
             (char (*) [1])0x41e0e0);
  if (usepaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (char **)&usepaths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>>
            ();
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>>
  ::
  unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>,std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>>,void>
            ((unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>>
              *)&local_388,&local_390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            ((ChaiScript_Basic *)local_380,&local_388,&local_3a8,&local_3c0,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)
             &threads.
              super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~vector
            ((vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)
             &threads.
              super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  ::~unique_ptr(&local_388);
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>,_std::default_delete<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>_>_>
  ::~unique_ptr(&local_390);
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::vector
            ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *
             )&num_threads);
  iVar1 = std::thread::hardware_concurrency();
  i._4_4_ = iVar1 + -1;
  i._0_4_ = 2;
  piVar3 = std::max<int>((int *)((long)&i + 4),(int *)&i);
  local_3f8 = (ulong)*piVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"Num threads: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3f8);
  std::operator<<(poVar4,'\n');
  for (local_408 = 0; local_408 < local_3f8; local_408 = local_408 + 1) {
    i_1 = (size_t)std::ref<chaiscript::ChaiScript_Basic>((ChaiScript_Basic *)local_380);
    std::
    make_shared<std::thread,void(&)(chaiscript::ChaiScript_Basic&,unsigned_long),std::reference_wrapper<chaiscript::ChaiScript_Basic>,unsigned_long&>
              ((_func_void_ChaiScript_Basic_ptr_unsigned_long *)&local_418,
               (reference_wrapper<chaiscript::ChaiScript_Basic> *)do_work,&i_1);
    std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
    push_back((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
               *)&num_threads,&local_418);
    std::shared_ptr<std::thread>::~shared_ptr(&local_418);
  }
  for (i_2 = 0; i_2 < local_3f8; i_2 = i_2 + 1) {
    this_00 = (__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
              operator[]((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                          *)&num_threads,i_2);
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (this_00);
    std::thread::join();
  }
  for (local_430 = 0; local_430 < local_3f8; local_430 = local_430 + 1) {
    std::__cxx11::stringstream::stringstream(local_5b8);
    std::ostream::operator<<(local_5a8,local_430);
    std::__cxx11::stringstream::str();
    std::operator+(&local_5f8,"getvalue(",&local_618);
    std::operator+(&local_5d8,&local_5f8,")");
    std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr(&local_628);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"__EVAL__",&local_649);
    iVar1 = chaiscript::ChaiScript_Basic::eval<int>
                      ((ChaiScript_Basic *)local_380,&local_5d8,&local_628,&local_648);
    iVar2 = expected_value(4000);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr(&local_628);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_618);
    if (iVar1 == iVar2) {
      std::__cxx11::stringstream::str();
      std::operator+(&local_690,"getid(",&local_6b0);
      std::operator+(&local_670,&local_690,")");
      std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr(&local_6c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"__EVAL__",&local_6e1)
      ;
      iVar1 = chaiscript::ChaiScript_Basic::eval<int>
                        ((ChaiScript_Basic *)local_380,&local_670,&local_6c0,&local_6e0);
      iVar2 = (int)local_430;
      std::__cxx11::string::~string((string *)&local_6e0);
      std::allocator<char>::~allocator(&local_6e1);
      std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr(&local_6c0);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      if (iVar1 == iVar2) {
        local_650 = 0;
      }
      else {
        usepath._4_4_ = 1;
        local_650 = 1;
      }
    }
    else {
      usepath._4_4_ = 1;
      local_650 = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_5b8);
    if (local_650 != 0) goto LAB_002f84fa;
  }
  usepath._4_4_ = 0;
  local_650 = 1;
LAB_002f84fa:
  std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::~vector
            ((vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> *
             )&num_threads);
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic((ChaiScript_Basic *)local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return usepath._4_4_;
}

Assistant:

int main() {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#ifdef max // Why Microsoft? why?
#undef max
#endif
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;

#ifdef CHAISCRIPT_NO_DYNLOAD
  chaiscript::ChaiScript chai(/* unused */ modulepaths, usepaths);
#else
  modulepaths.emplace_back("");
  if (modulepath) {
    modulepaths.emplace_back(modulepath);
  }

  // For this test we are going to load the dynamic stdlib
  // to make sure it continues to work
  chaiscript::ChaiScript_Basic chai(
      std::make_unique<chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Noop_Tracer, chaiscript::optimizer::Optimizer_Default>>(),
      modulepaths,
      usepaths);
#endif

  std::vector<std::shared_ptr<std::thread>> threads;

  // Ensure at least two, but say only 7 on an 8 core processor
  size_t num_threads = static_cast<size_t>(std::max(static_cast<int>(std::thread::hardware_concurrency()) - 1, 2));

  std::cout << "Num threads: " << num_threads << '\n';

  for (size_t i = 0; i < num_threads; ++i) {
    threads.push_back(std::make_shared<std::thread>(do_work, std::ref(chai), i));
  }

  for (size_t i = 0; i < num_threads; ++i) {
    threads[i]->join();
  }

  for (size_t i = 0; i < num_threads; ++i) {
    std::stringstream ss;
    ss << i;
    if (chai.eval<int>("getvalue(" + ss.str() + ")") != expected_value(4000)) {
      return EXIT_FAILURE;
    }

    if (chai.eval<int>("getid(" + ss.str() + ")") != static_cast<int>(i)) {
      return EXIT_FAILURE;
    }
  }

  return EXIT_SUCCESS;
}